

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SectionParser.cpp
# Opt level: O0

bool __thiscall OpenMD::SectionParser::isEndSection(SectionParser *this,string *line)

{
  bool bVar1;
  int iVar2;
  StringTokenizer *in_RSI;
  string section;
  string keyword;
  StringTokenizer tokenizer;
  char *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  string local_c8 [55];
  undefined1 local_91 [41];
  StringTokenizer *in_stack_ffffffffffffff98;
  __type_conflict local_1;
  
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             (char *)in_stack_ffffffffffffff28,(allocator<char> *)in_stack_ffffffffffffff20);
  StringTokenizer::StringTokenizer
            ((StringTokenizer *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::__cxx11::string::~string((string *)(local_91 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_91);
  iVar2 = StringTokenizer::countTokens(in_RSI);
  if (iVar2 < 2) {
    local_1 = false;
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(in_stack_ffffffffffffff98);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(iVar2,in_stack_fffffffffffffef0),in_stack_fffffffffffffee8);
    in_stack_fffffffffffffef0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffef0);
    if (bVar1) {
      local_1 = false;
    }
    else {
      StringTokenizer::nextToken_abi_cxx11_(in_stack_ffffffffffffff98);
      local_1 = std::operator==(in_stack_ffffffffffffff10,__rhs);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
    }
    std::__cxx11::string::~string(local_c8);
  }
  StringTokenizer::~StringTokenizer((StringTokenizer *)CONCAT44(iVar2,in_stack_fffffffffffffef0));
  return local_1;
}

Assistant:

bool SectionParser::isEndSection(const std::string& line) {
    StringTokenizer tokenizer(line);

    if (tokenizer.countTokens() >= 2) {
      std::string keyword = tokenizer.nextToken();

      if (keyword != "end") { return false; }

      std::string section = tokenizer.nextToken();
      if (section == sectionName_) {
        return true;
      } else {
        return false;
      }

    } else {
      return false;
    }
  }